

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_test_pri(REF_DBL (*xyz) [3],REF_BOOL *possible)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int in_EAX;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  *possible = 1;
  dVar1 = (*xyz)[0];
  dVar2 = (*xyz)[1];
  dVar7 = xyz[1][1] - dVar2;
  dVar3 = (*xyz)[2];
  dVar6 = xyz[2][2] - dVar3;
  dVar8 = xyz[1][2] - dVar3;
  dVar10 = xyz[2][1] - dVar2;
  dVar9 = xyz[1][0] - dVar1;
  dVar11 = xyz[2][0] - dVar1;
  if (((xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 - (dVar3 + xyz[1][2] + xyz[2][2]) / 3.0) *
      (dVar9 * dVar10 - dVar11 * dVar7) * 0.5 +
      ((xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 - (xyz[1][1] + dVar2 + xyz[2][1]) / 3.0) *
      (dVar6 * dVar9 - dVar8 * dVar11) * -0.5 +
      ((xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 - (xyz[1][0] + dVar1 + xyz[2][0]) / 3.0) *
      (dVar7 * dVar6 - dVar10 * dVar8) * 0.5 < 0.0) {
    in_EAX = puts("bad pri base");
    *possible = 0;
  }
  dVar1 = xyz[3][1];
  dVar7 = xyz[5][1] - dVar1;
  dVar2 = xyz[3][2];
  dVar6 = xyz[4][2] - dVar2;
  dVar9 = xyz[5][2] - dVar2;
  dVar10 = xyz[4][1] - dVar1;
  dVar3 = xyz[3][0];
  dVar8 = xyz[5][0] - dVar3;
  dVar11 = xyz[4][0] - dVar3;
  if ((((*xyz)[2] + xyz[1][2] + xyz[2][2]) / 3.0 - (xyz[4][2] + dVar2 + xyz[5][2]) / 3.0) *
      (dVar8 * dVar10 - dVar11 * dVar7) * 0.5 +
      (((*xyz)[1] + xyz[1][1] + xyz[2][1]) / 3.0 - (dVar1 + xyz[4][1] + xyz[5][1]) / 3.0) *
      (dVar6 * dVar8 - dVar9 * dVar11) * -0.5 +
      (((*xyz)[0] + xyz[1][0] + xyz[2][0]) / 3.0 - (dVar3 + xyz[4][0] + xyz[5][0]) / 3.0) *
      (dVar7 * dVar6 - dVar10 * dVar9) * 0.5 < 0.0) {
    in_EAX = puts("bad pri top");
    *possible = 0;
  }
  if (*possible != 0) {
    return in_EAX;
  }
  printf("zone t=\"bad\", nodes=6, elements=1, datapacking=point, zonetype=febrick");
  lVar5 = 0x10;
  do {
    printf(" %.16e %.16e %.16e\n",*(undefined8 *)((long)xyz[-1] + lVar5 + 8),
           *(undefined8 *)((long)xyz[-1] + lVar5 + 0x10),*(undefined8 *)((long)*xyz + lVar5));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xa0);
  iVar4 = puts(" 1 2 3 3 4 5 6 6");
  return iVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_test_pri(REF_DBL xyz[6][3],
                                              REF_BOOL *possible) {
  REF_INT n1, n2, n3;
  REF_DBL xnorm, ynorm, znorm;
  REF_DBL dx, dy, dz;
  REF_DBL crdot;

  REF_INT i;

  *possible = REF_TRUE;

  n1 = 0;
  n2 = 1;
  n3 = 2;

  xnorm = 0.5 * ((xyz[n2][1] - xyz[n1][1]) * (xyz[n3][2] - xyz[n1][2]) -
                 (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][1] - xyz[n1][1]));
  ynorm = -0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][2] - xyz[n1][2]) -
                  (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][0] - xyz[n1][0]));
  znorm = 0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][1] - xyz[n1][1]) -
                 (xyz[n2][1] - xyz[n1][1]) * (xyz[n3][0] - xyz[n1][0]));

  dx = (xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 -
       (xyz[0][0] + xyz[1][0] + xyz[2][0]) / 3.0;
  dy = (xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 -
       (xyz[0][1] + xyz[1][1] + xyz[2][1]) / 3.0;
  dz = (xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 -
       (xyz[0][2] + xyz[1][2] + xyz[2][2]) / 3.0;

  crdot = dx * xnorm + dy * ynorm + dz * znorm;

  if (crdot < 0.0) {
    printf("bad pri base\n");
    *possible = REF_FALSE;
  }

  n1 = 3;
  n2 = 5;
  n3 = 4;

  xnorm = 0.5 * ((xyz[n2][1] - xyz[n1][1]) * (xyz[n3][2] - xyz[n1][2]) -
                 (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][1] - xyz[n1][1]));
  ynorm = -0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][2] - xyz[n1][2]) -
                  (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][0] - xyz[n1][0]));
  znorm = 0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][1] - xyz[n1][1]) -
                 (xyz[n2][1] - xyz[n1][1]) * (xyz[n3][0] - xyz[n1][0]));

  dx = -(xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 +
       (xyz[0][0] + xyz[1][0] + xyz[2][0]) / 3.0;
  dy = -(xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 +
       (xyz[0][1] + xyz[1][1] + xyz[2][1]) / 3.0;
  dz = -(xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 +
       (xyz[0][2] + xyz[1][2] + xyz[2][2]) / 3.0;

  crdot = dx * xnorm + dy * ynorm + dz * znorm;

  if (crdot < 0.0) {
    printf("bad pri top\n");
    *possible = REF_FALSE;
  }

  if (!*possible) {
    printf(
        "zone t=\"bad\", nodes=6, elements=1, datapacking=point, "
        "zonetype=febrick");
    for (i = 0; i < 6; i++)
      printf(" %.16e %.16e %.16e\n", xyz[i][0], xyz[i][1], xyz[i][2]);
    printf(" 1 2 3 3 4 5 6 6\n");
  }

  return REF_SUCCESS;
}